

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,BorderAgent *aBorderAgent)

{
  State *extraout_RDX;
  State *extraout_RDX_00;
  State *extraout_RDX_01;
  ByteArray *aBytes;
  State *extraout_RDX_02;
  State *extraout_RDX_03;
  State *aState;
  allocator local_409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  allocator local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340;
  allocator local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  allocator local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  allocator local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  Interpreter *local_18;
  BorderAgent *aBorderAgent_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  aBorderAgent_local = (BorderAgent *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  aState = extraout_RDX;
  if (((undefined1  [16])local_18[1].mThreadAdministratorPasscode.field_2 & (undefined1  [16])0x1)
      != (undefined1  [16])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"Addr=",&local_81);
    std::operator+(&local_60,&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(local_18->mContext).mNwkAliases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    std::operator+(&local_40,&local_60,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    aState = extraout_RDX_00;
  }
  if (((undefined1  [16])local_18[1].mThreadAdministratorPasscode.field_2 & (undefined1  [16])0x2)
      != (undefined1  [16])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"Port=",&local_f9);
    std::__cxx11::to_string
              (&local_120,
               (uint)*(ushort *)
                      &(local_18->mContext).mDomAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_d8,&local_f8,&local_120);
    std::operator+(&local_b8,&local_d8,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    aState = extraout_RDX_01;
  }
  if (((undefined1  [16])local_18[1].mThreadAdministratorPasscode.field_2 & (undefined1  [16])0x8000
      ) != (undefined1  [16])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"Discriminator=",&local_181);
    utils::Hex_abi_cxx11_(&local_1a8,(utils *)&(local_18->mContext).mExportFiles,aBytes);
    std::operator+(&local_160,&local_180,&local_1a8);
    std::operator+(&local_140,&local_160,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    aState = extraout_RDX_02;
  }
  if (((undefined1  [16])local_18[1].mThreadAdministratorPasscode.field_2 & (undefined1  [16])0x4)
      != (undefined1  [16])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"ThreadVersion=",&local_209);
    std::operator+(&local_1e8,&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(local_18->mContext).mImportFiles);
    std::operator+(&local_1c8,&local_1e8,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    aState = extraout_RDX_03;
  }
  if (((undefined1  [16])local_18[1].mThreadAdministratorPasscode.field_2 & (undefined1  [16])0x8)
      != (undefined1  [16])0x0) {
    ToString_abi_cxx11_(&local_250,
                        (Interpreter *)
                        &(local_18->mContext).mCommandKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,aState);
    std::operator+(&local_230,&local_250,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
  }
  if (((undefined1  [16])local_18[1].mThreadAdministratorPasscode.field_2 & (undefined1  [16])0x10)
      != (undefined1  [16])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b0,"NetworkName=",&local_2b1);
    std::operator+(&local_290,&local_2b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(local_18->mContext).mCommandKeys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_270,&local_290,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  }
  if (((undefined1  [16])local_18[1].mThreadAdministratorPasscode.field_2 & (undefined1  [16])0x20)
      != (undefined1  [16])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"ExtendedPanId=",&local_319);
    ToHex<unsigned_long>
              (&local_340,
               (unsigned_long)
               (local_18->mRegistry).
               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    std::operator+(&local_2f8,&local_318,&local_340);
    std::operator+(&local_2d8,&local_2f8,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
  }
  if (((undefined1  [16])local_18[1].mThreadAdministratorPasscode.field_2 & (undefined1  [16])0x40)
      != (undefined1  [16])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"VendorName=",&local_3a1);
    std::operator+(&local_380,&local_3a0,&local_18->mThreadAdministratorPasscode);
    std::operator+(&local_360,&local_380,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  }
  if (((undefined1  [16])local_18[1].mThreadAdministratorPasscode.field_2 & (undefined1  [16])0x80)
      != (undefined1  [16])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"ModelName=",&local_409);
    std::operator+(&local_3e8,&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_18->mShouldExit);
    std::operator+(&local_3c8,&local_3e8,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const BorderAgent &aBorderAgent)
{
    std::string ret;

#define BUILD_STRING(name, nameStr)                             \
    if (aBorderAgent.mPresentFlags & BorderAgent::k##name##Bit) \
    {                                                           \
        ret += std::string(#name "=") + nameStr + "\n";         \
    };

    BUILD_STRING(Addr, aBorderAgent.mAddr);
    BUILD_STRING(Port, std::to_string(aBorderAgent.mPort));
    BUILD_STRING(Discriminator, utils::Hex(aBorderAgent.mDiscriminator));
    BUILD_STRING(ThreadVersion, aBorderAgent.mThreadVersion);
    if (aBorderAgent.mPresentFlags & BorderAgent::kStateBit)
    {
        ret += ToString(aBorderAgent.mState) + "\n";
    }
    BUILD_STRING(NetworkName, aBorderAgent.mNetworkName);
    BUILD_STRING(ExtendedPanId, ToHex(aBorderAgent.mExtendedPanId));
    BUILD_STRING(VendorName, aBorderAgent.mVendorName);
    BUILD_STRING(ModelName, aBorderAgent.mModelName);

    // TODO(wgtdkp): more fields

#undef TO_STRING

    return ret;
}